

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O3

void Wln_RetPrintObj(Wln_Ret_t *p,int iObj)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  ulong uVar5;
  char *pcVar6;
  Wln_Ntk_t *pWVar7;
  Wln_Vec_t *pWVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  
  if (-1 < iObj) {
    uVar5 = (ulong)(uint)iObj;
    if (iObj < (p->pNtk->vTypes).nSize) {
      pcVar6 = Abc_OperName((p->pNtk->vTypes).pArray[uVar5]);
      pWVar7 = p->pNtk;
      if ((iObj < (pWVar7->vNameIds).nSize) && (iObj < (pWVar7->vInstIds).nSize)) {
        printf("Obj %6d : Type = %6s  NameId = %5d  InstId = %5d  Fanins = %d : ",uVar5,pcVar6,
               (ulong)(uint)(pWVar7->vNameIds).pArray[uVar5],
               (ulong)(uint)(pWVar7->vInstIds).pArray[uVar5],
               (ulong)(uint)pWVar7->vFanins[uVar5].nSize);
        pWVar7 = p->pNtk;
        pWVar8 = pWVar7->vFanins;
        if (0 < pWVar8[uVar5].nSize) {
          lVar12 = 0;
          do {
            uVar1 = (p->vFanins).nSize;
            if ((int)uVar1 <= iObj) goto LAB_00387d3a;
            piVar4 = (p->vFanins).pArray;
            lVar11 = (long)piVar4[uVar5];
            if ((lVar11 < 0) || (uVar1 <= (uint)piVar4[uVar5])) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
            }
            iVar2 = piVar4[lVar11 + lVar12 * 2];
            lVar9 = (long)iVar2;
            if (lVar9 != 0) {
              if (pWVar8[lVar9].nSize == 0) {
                if ((iVar2 < 0) || ((pWVar7->vTypes).nSize <= iVar2)) goto LAB_00387d3a;
                if ((pWVar7->vTypes).pArray[lVar9] != 3) goto LAB_00387d0a;
              }
              printf("%5d ");
              uVar1 = piVar4[lVar11 + lVar12 * 2 + 1];
              uVar10 = (ulong)uVar1;
              if (uVar10 != 0) {
                if ((((int)uVar1 < 0) || (uVar3 = (p->vEdgeLinks).nSize, (int)uVar3 <= (int)uVar1))
                   || (uVar3 <= uVar1 + 1)) goto LAB_00387d3a;
                piVar4 = (p->vEdgeLinks).pArray;
                printf("(%d : %d %d) ",uVar10,(ulong)(uint)piVar4[uVar10],
                       (ulong)(uint)piVar4[uVar1 + 1]);
              }
            }
LAB_00387d0a:
            lVar12 = lVar12 + 1;
            pWVar7 = p->pNtk;
            pWVar8 = pWVar7->vFanins;
          } while (lVar12 < pWVar8[uVar5].nSize);
        }
        putchar(10);
        return;
      }
    }
  }
LAB_00387d3a:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Wln_RetPrintObj( Wln_Ret_t * p, int iObj )
{
    int k, iFanin, Type = Wln_ObjType(p->pNtk, iObj), * pLink;
    printf( "Obj %6d : Type = %6s  NameId = %5d  InstId = %5d  Fanins = %d : ", 
        iObj, Abc_OperName(Type), Wln_ObjNameId(p->pNtk, iObj), Wln_ObjInstId(p->pNtk, iObj), Wln_ObjFaninNum(p->pNtk, iObj) );
    Wln_RetForEachFanin( p, iObj, iFanin, pLink, k )
    {
        printf( "%5d ", iFanin );
        if ( !pLink[0] )
            continue;
        printf( "(%d : %d %d) ", pLink[0], 
            Vec_IntEntry(&p->vEdgeLinks, pLink[0]), 
            Vec_IntEntry(&p->vEdgeLinks, pLink[0]+1) );
    }
    printf( "\n" );
}